

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

void aom_quantize_b_adaptive_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  short sVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  int zbins [2];
  int nzbins [2];
  int prescan_add [2];
  
  bVar2 = (byte)log_scale;
  iVar12 = (1 << (bVar2 & 0x1f)) >> 1;
  zbins[0] = *zbin_ptr + iVar12 >> (bVar2 & 0x1f);
  nzbins[0] = -zbins[0];
  zbins[1] = zbin_ptr[1] + iVar12 >> (bVar2 & 0x1f);
  nzbins[1] = -zbins[1];
  memset(qcoeff_ptr,0,n_coeffs * 4);
  memset(dqcoeff_ptr,0,n_coeffs * 4);
  for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
    prescan_add[lVar15] = dequant_ptr[lVar15] * 0x145 + 0x40 >> 7;
  }
  uVar9 = n_coeffs & 0xffffffff;
  while (uVar6 = uVar9, 0 < (int)uVar6) {
    sVar1 = scan[uVar6 - 1];
    uVar4 = 0x20;
    if (qm_ptr != (qm_val_t *)0x0) {
      uVar4 = (uint)qm_ptr[sVar1];
    }
    uVar9 = (ulong)((uint)(sVar1 != 0) * 4);
    iVar10 = *(int *)((long)prescan_add + uVar9);
    if ((*(int *)((long)zbins + uVar9) * 0x20 + iVar10 <= (int)(uVar4 * coeff_ptr[sVar1])) ||
       (uVar9 = uVar6 - 1, (int)(uVar4 * coeff_ptr[sVar1]) <= nzbins[sVar1 != 0] * 0x20 - iVar10))
    goto LAB_00247ac7;
  }
  uVar6 = (ulong)((int)(uint)n_coeffs >> 0x1f & (uint)n_coeffs);
LAB_00247ac7:
  uVar13 = 0;
  uVar9 = uVar6 & 0xffffffff;
  if ((int)uVar6 < 1) {
    uVar9 = uVar13;
  }
  uVar6 = 0xffffffffffffffff;
  uVar11 = 0xffffffff;
  while( true ) {
    iVar10 = (int)uVar11;
    iVar5 = (int)uVar6;
    if (uVar9 == uVar13) break;
    sVar1 = scan[uVar13];
    iVar10 = coeff_ptr[sVar1];
    iVar7 = -iVar10;
    if (0 < iVar10) {
      iVar7 = iVar10;
    }
    if (qm_ptr == (qm_val_t *)0x0) {
      bVar3 = 0x20;
    }
    else {
      bVar3 = qm_ptr[sVar1];
    }
    bVar17 = sVar1 != 0;
    if (zbins[bVar17] * 0x20 <= (int)(iVar7 * (uint)bVar3)) {
      uVar16 = (ulong)((uint)bVar17 * 2);
      iVar7 = (*(short *)((long)round_ptr + uVar16) + iVar12 >> (bVar2 & 0x1f)) + iVar7;
      if (0x7ffe < iVar7) {
        iVar7 = 0x7fff;
      }
      if (iVar7 < -0x7fff) {
        iVar7 = -0x8000;
      }
      uVar8 = iVar10 >> 0x1f;
      uVar14 = (uint)((long)((long)*(short *)((long)quant_shift_ptr + uVar16) *
                            (((long)((long)*(short *)((long)quant_ptr + uVar16) *
                                    (ulong)bVar3 * (long)iVar7) >> 0x10) +
                            (ulong)bVar3 * (long)iVar7)) >> (0x15 - bVar2 & 0x3f));
      qcoeff_ptr[sVar1] = (uVar8 ^ uVar14) - uVar8;
      uVar4 = 0x20;
      if (iqm_ptr != (qm_val_t *)0x0) {
        uVar4 = (uint)iqm_ptr[sVar1];
      }
      dqcoeff_ptr[sVar1] =
           ((int)(((int)((int)dequant_ptr[bVar17] * uVar4 + 0x10) >> 5) * uVar14) >> (bVar2 & 0x1f)
           ^ uVar8) - uVar8;
      if (uVar14 != 0) {
        if (iVar5 == -1) {
          uVar6 = uVar13;
        }
        uVar6 = uVar6 & 0xffffffff;
        uVar11 = uVar13 & 0xffffffff;
      }
    }
    uVar13 = uVar13 + 1;
  }
  if (iVar5 == iVar10 && -1 < iVar10) {
    sVar1 = scan[uVar6 & 0xffffffff];
    iVar10 = iVar5;
    if ((qcoeff_ptr[sVar1] == 1) || (qcoeff_ptr[sVar1] == -1)) {
      if (qm_ptr == (qm_val_t *)0x0) {
        uVar4 = 0x20;
      }
      else {
        uVar4 = (uint)qm_ptr[sVar1];
      }
      bVar17 = sVar1 != 0;
      iVar12 = dequant_ptr[bVar17] * 0x20d + 0x40 >> 7;
      if (((int)(uVar4 * coeff_ptr[sVar1]) < zbins[bVar17] * 0x20 + iVar12) &&
         (nzbins[bVar17] * 0x20 - iVar12 < (int)(uVar4 * coeff_ptr[sVar1]))) {
        qcoeff_ptr[sVar1] = 0;
        dqcoeff_ptr[sVar1] = 0;
        iVar10 = -1;
      }
    }
  }
  *eob_ptr = (short)iVar10 + 1;
  return;
}

Assistant:

void aom_quantize_b_adaptive_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int i, non_zero_count = (int)n_coeffs, eob = -1;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  int prescan_add[2];
  for (i = 0; i < 2; ++i)
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;
    const int prescan_add_val = prescan_add[rc != 0];
    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif  // SKIP_EOB_FACTOR_ADJUST
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32;

    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      int64_t tmp =
          clamp(abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale),
                INT16_MIN, INT16_MAX);
      tmp *= wt;
      tmp32 = (int)(((((tmp * quant_ptr[rc != 0]) >> 16) + tmp) *
                     quant_shift_ptr[rc != 0]) >>
                    (16 - log_scale + AOM_QM_BITS));  // quantization
      qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
      const int iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);

      if (tmp32) {
        eob = i;
#if SKIP_EOB_FACTOR_ADJUST
        if (first == -1) first = i;
#endif  // SKIP_EOB_FACTOR_ADJUST
      }
    }
  }
#if SKIP_EOB_FACTOR_ADJUST
  if (eob >= 0 && first == eob) {
    const int rc = scan[eob];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const int coeff = coeff_ptr[rc] * wt;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
          coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        eob = -1;
      }
    }
  }
#endif  // SKIP_EOB_FACTOR_ADJUST
  *eob_ptr = eob + 1;
}